

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O0

void Nwk_ManDumpBlif(Nwk_Man_t *pNtk,char *pFileName,Vec_Ptr_t *vPiNames,Vec_Ptr_t *vPoNames)

{
  Hop_Man_t *p;
  int iVar1;
  uint uVar2;
  FILE *__stream;
  void *pvVar3;
  Aig_MmFlex_t *p_00;
  Vec_Int_t *vTruth_00;
  Vec_Int_t *vCover_00;
  Vec_Ptr_t *p_01;
  Nwk_Obj_t *pNVar4;
  Hop_Obj_t *pRoot;
  uint *pOut;
  char *pcVar5;
  Nwk_Obj_t *pNVar6;
  bool bVar7;
  int local_78;
  int nDigits;
  int k;
  int i;
  uint *pTruth;
  char *pSop;
  Aig_MmFlex_t *pMem;
  Nwk_Obj_t *pFanin;
  Nwk_Obj_t *pObj;
  Vec_Int_t *vCover;
  Vec_Int_t *vTruth;
  Vec_Ptr_t *vNodes;
  FILE *pFile;
  Vec_Ptr_t *vPoNames_local;
  Vec_Ptr_t *vPiNames_local;
  char *pFileName_local;
  Nwk_Man_t *pNtk_local;
  
  iVar1 = Nwk_ManPoNum(pNtk);
  if (iVar1 == 0) {
    printf("Nwk_ManDumpBlif(): Network does not have POs.\n");
  }
  else {
    uVar2 = Nwk_ManObjNumMax(pNtk);
    uVar2 = Abc_Base10Log(uVar2);
    __stream = fopen(pFileName,"w");
    fprintf(__stream,"# BLIF file written by procedure Nwk_ManDumpBlif()\n");
    fprintf(__stream,".model %s\n",pNtk->pName);
    fprintf(__stream,".inputs");
    for (nDigits = 0; iVar1 = Vec_PtrSize(pNtk->vCis), nDigits < iVar1; nDigits = nDigits + 1) {
      pvVar3 = Vec_PtrEntry(pNtk->vCis,nDigits);
      if (vPiNames == (Vec_Ptr_t *)0x0) {
        fprintf(__stream," n%0*d",(ulong)uVar2,(ulong)*(uint *)((long)pvVar3 + 0x24));
      }
      else {
        pvVar3 = Vec_PtrEntry(vPiNames,nDigits);
        fprintf(__stream," %s",pvVar3);
      }
    }
    fprintf(__stream,"\n");
    fprintf(__stream,".outputs");
    for (nDigits = 0; iVar1 = Vec_PtrSize(pNtk->vCos), nDigits < iVar1; nDigits = nDigits + 1) {
      pvVar3 = Vec_PtrEntry(pNtk->vCos,nDigits);
      if (vPoNames == (Vec_Ptr_t *)0x0) {
        fprintf(__stream," n%0*d",(ulong)uVar2,(ulong)*(uint *)((long)pvVar3 + 0x24));
      }
      else {
        pvVar3 = Vec_PtrEntry(vPoNames,nDigits);
        fprintf(__stream," %s",pvVar3);
      }
    }
    fprintf(__stream,"\n");
    p_00 = Aig_MmFlexStart();
    vTruth_00 = Vec_IntAlloc(0x10000);
    vCover_00 = Vec_IntAlloc(0x10000);
    p_01 = Nwk_ManDfs(pNtk);
    for (nDigits = 0; iVar1 = Vec_PtrSize(p_01), nDigits < iVar1; nDigits = nDigits + 1) {
      pNVar4 = (Nwk_Obj_t *)Vec_PtrEntry(p_01,nDigits);
      iVar1 = Nwk_ObjIsNode(pNVar4);
      if (iVar1 != 0) {
        p = pNtk->pManHop;
        pRoot = Hop_Regular(pNVar4->pFunc);
        iVar1 = Nwk_ObjFaninNum(pNVar4);
        pOut = Hop_ManConvertAigToTruth(p,pRoot,iVar1,vTruth_00,0);
        iVar1 = Hop_IsComplement(pNVar4->pFunc);
        if (iVar1 != 0) {
          iVar1 = Nwk_ObjFaninNum(pNVar4);
          Kit_TruthNot(pOut,pOut,iVar1);
        }
        iVar1 = Nwk_ObjFaninNum(pNVar4);
        pcVar5 = Kit_PlaFromTruth(p_00,pOut,iVar1,vCover_00);
        fprintf(__stream,".names");
        iVar1 = Nwk_ObjFaninNum(pNVar4);
        iVar1 = Kit_TruthIsConst0(pOut,iVar1);
        if (iVar1 == 0) {
          iVar1 = Nwk_ObjFaninNum(pNVar4);
          iVar1 = Kit_TruthIsConst1(pOut,iVar1);
          if (iVar1 == 0) {
            local_78 = 0;
            while( true ) {
              bVar7 = false;
              if (local_78 < pNVar4->nFanins) {
                pMem = (Aig_MmFlex_t *)pNVar4->pFanio[local_78];
                bVar7 = (Nwk_Obj_t *)pMem != (Nwk_Obj_t *)0x0;
              }
              if (!bVar7) break;
              if ((vPiNames == (Vec_Ptr_t *)0x0) ||
                 (iVar1 = Nwk_ObjIsPi((Nwk_Obj_t *)pMem), iVar1 == 0)) {
                fprintf(__stream," n%0*d",(ulong)uVar2,(ulong)*(uint *)&pMem->field_0x24);
              }
              else {
                iVar1 = Nwk_ObjPioNum((Nwk_Obj_t *)pMem);
                pvVar3 = Vec_PtrEntry(vPiNames,iVar1);
                fprintf(__stream," %s",pvVar3);
              }
              local_78 = local_78 + 1;
            }
          }
        }
        fprintf(__stream," n%0*d\n",(ulong)uVar2,(ulong)(uint)pNVar4->Id);
        fprintf(__stream,"%s",pcVar5);
      }
    }
    Vec_IntFree(vCover_00);
    Vec_IntFree(vTruth_00);
    Vec_PtrFree(p_01);
    Aig_MmFlexStop(p_00,0);
    for (nDigits = 0; iVar1 = Vec_PtrSize(pNtk->vCos), nDigits < iVar1; nDigits = nDigits + 1) {
      pNVar4 = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vCos,nDigits);
      fprintf(__stream,".names");
      if (vPiNames == (Vec_Ptr_t *)0x0) {
LAB_0060493f:
        pNVar6 = Nwk_ObjFanin0(pNVar4);
        fprintf(__stream," n%0*d",(ulong)uVar2,(ulong)(uint)pNVar6->Id);
      }
      else {
        pNVar6 = Nwk_ObjFanin0(pNVar4);
        iVar1 = Nwk_ObjIsPi(pNVar6);
        if (iVar1 == 0) goto LAB_0060493f;
        pNVar6 = Nwk_ObjFanin0(pNVar4);
        iVar1 = Nwk_ObjPioNum(pNVar6);
        pvVar3 = Vec_PtrEntry(vPiNames,iVar1);
        fprintf(__stream," %s",pvVar3);
      }
      if (vPoNames == (Vec_Ptr_t *)0x0) {
        fprintf(__stream," n%0*d\n",(ulong)uVar2,(ulong)(uint)pNVar4->Id);
      }
      else {
        iVar1 = Nwk_ObjPioNum(pNVar4);
        pvVar3 = Vec_PtrEntry(vPoNames,iVar1);
        fprintf(__stream," %s\n",pvVar3);
      }
      fprintf(__stream,"%d 1\n",(ulong)(((*(uint *)&pNVar4->field_0x20 >> 3 & 1) != 0 ^ 0xffU) & 1))
      ;
    }
    fprintf(__stream,".end\n\n");
    fclose(__stream);
  }
  return;
}

Assistant:

void Nwk_ManDumpBlif( Nwk_Man_t * pNtk, char * pFileName, Vec_Ptr_t * vPiNames, Vec_Ptr_t * vPoNames )
{
    FILE * pFile;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vTruth;
    Vec_Int_t * vCover;
    Nwk_Obj_t * pObj, * pFanin;
    Aig_MmFlex_t * pMem;
    char * pSop = NULL;
    unsigned * pTruth;
    int i, k, nDigits;
    if ( Nwk_ManPoNum(pNtk) == 0 )
    {
        printf( "Nwk_ManDumpBlif(): Network does not have POs.\n" );
        return;
    }
    // collect nodes in the DFS order
    nDigits = Abc_Base10Log( Nwk_ManObjNumMax(pNtk) );
    // write the file 
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# BLIF file written by procedure Nwk_ManDumpBlif()\n" );
//    fprintf( pFile, "# http://www.eecs.berkeley.edu/~alanmi/abc/\n" );
    fprintf( pFile, ".model %s\n", pNtk->pName );
    // write PIs
    fprintf( pFile, ".inputs" );
    Nwk_ManForEachCi( pNtk, pObj, i )
        if ( vPiNames )
            fprintf( pFile, " %s", (char*)Vec_PtrEntry(vPiNames, i) );
        else
            fprintf( pFile, " n%0*d", nDigits, pObj->Id );
    fprintf( pFile, "\n" );
    // write POs
    fprintf( pFile, ".outputs" );
    Nwk_ManForEachCo( pNtk, pObj, i )
        if ( vPoNames )
            fprintf( pFile, " %s", (char*)Vec_PtrEntry(vPoNames, i) );
        else
            fprintf( pFile, " n%0*d", nDigits, pObj->Id );
    fprintf( pFile, "\n" );
    // write nodes
    pMem = Aig_MmFlexStart();
    vTruth = Vec_IntAlloc( 1 << 16 );
    vCover = Vec_IntAlloc( 1 << 16 );
    vNodes = Nwk_ManDfs( pNtk );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pObj, i )
    {
        if ( !Nwk_ObjIsNode(pObj) )
            continue;
        // derive SOP for the AIG
        pTruth = Hop_ManConvertAigToTruth( pNtk->pManHop, Hop_Regular(pObj->pFunc), Nwk_ObjFaninNum(pObj), vTruth, 0 );
        if ( Hop_IsComplement(pObj->pFunc) )
            Kit_TruthNot( pTruth, pTruth, Nwk_ObjFaninNum(pObj) );
        pSop = Kit_PlaFromTruth( pMem, pTruth, Nwk_ObjFaninNum(pObj), vCover );
        // write the node
        fprintf( pFile, ".names" );
        if ( !Kit_TruthIsConst0(pTruth, Nwk_ObjFaninNum(pObj)) && !Kit_TruthIsConst1(pTruth, Nwk_ObjFaninNum(pObj)) )
        {
            Nwk_ObjForEachFanin( pObj, pFanin, k )
                if ( vPiNames && Nwk_ObjIsPi(pFanin) )
                    fprintf( pFile, " %s", (char*)Vec_PtrEntry(vPiNames, Nwk_ObjPioNum(pFanin)) );
                else
                    fprintf( pFile, " n%0*d", nDigits, pFanin->Id );
        }
        fprintf( pFile, " n%0*d\n", nDigits, pObj->Id );
        // write the function
        fprintf( pFile, "%s", pSop );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vTruth );
    Vec_PtrFree( vNodes );
    Aig_MmFlexStop( pMem, 0 );
    // write POs
    Nwk_ManForEachCo( pNtk, pObj, i )
    {
        fprintf( pFile, ".names" );
        if ( vPiNames && Nwk_ObjIsPi(Nwk_ObjFanin0(pObj)) )
            fprintf( pFile, " %s", (char*)Vec_PtrEntry(vPiNames, Nwk_ObjPioNum(Nwk_ObjFanin0(pObj))) );
        else
            fprintf( pFile, " n%0*d", nDigits, Nwk_ObjFanin0(pObj)->Id );
        if ( vPoNames )
            fprintf( pFile, " %s\n", (char*)Vec_PtrEntry(vPoNames, Nwk_ObjPioNum(pObj)) );
        else
            fprintf( pFile, " n%0*d\n", nDigits, pObj->Id );
        fprintf( pFile, "%d 1\n", !pObj->fInvert );
    }
    fprintf( pFile, ".end\n\n" );
    fclose( pFile );
}